

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

_Bool parse_paint(element_t *element,int id,paint_t *paint)

{
  byte bVar1;
  long lVar2;
  int *piVar3;
  _Bool _Var4;
  uint uVar5;
  char *it;
  attribute *paVar6;
  char *it_1;
  attribute *paVar8;
  ulong uVar9;
  attribute *paVar10;
  char *pcVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  attribute *paVar15;
  bool bVar16;
  attribute *local_38;
  attribute *paVar7;
  
  do {
    for (paVar7 = element->attributes; paVar7 != (attribute *)0x0; paVar7 = paVar7->next) {
      if (paVar7->id == id) {
        paVar15 = (attribute *)(paVar7->value).data;
        sVar12 = (paVar7->value).length;
        if (sVar12 == 7) {
          uVar5 = strncmp((char *)paVar15,"inherit",7);
          paVar7 = (attribute *)(ulong)uVar5;
          if (uVar5 == 0) break;
        }
        else if ((long)sVar12 < 1) {
          pcVar11 = "none";
          paVar6 = paVar15;
          goto LAB_00107d92;
        }
        paVar6 = (attribute *)((long)&paVar15->id + sVar12);
        pcVar11 = "none" + sVar12;
        lVar13 = 0;
        goto LAB_00107d70;
      }
    }
    element = element->parent;
  } while (element != (element *)0x0);
  goto LAB_00107d2f;
  while( true ) {
    if (*(char *)((long)&paVar15->id + lVar13) != "none"[lVar13]) goto LAB_00107d97;
    lVar2 = lVar13 + 1;
    lVar13 = lVar13 + 1;
    if ((attribute *)((long)&paVar15->id + lVar2) == paVar6) break;
LAB_00107d70:
    paVar7 = (attribute *)&paVar15->field_0x4;
    if (lVar13 == 4) goto LAB_00107dd5;
  }
LAB_00107d92:
  paVar7 = paVar6;
  if (*pcVar11 == '\0') {
LAB_00107dd5:
    paVar15 = (attribute *)((long)&paVar15->id + sVar12);
    paint->type = paint_type_none;
    if (paVar7 < paVar15) {
      do {
        uVar9 = (ulong)(byte)paVar7->id;
        if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
        paVar7 = (attribute *)((long)&paVar7->id + 1);
      } while (paVar7 != paVar15);
    }
    goto LAB_00107d2f;
  }
LAB_00107d97:
  paVar6 = (attribute *)((long)&paVar15->id + sVar12);
  if ((long)sVar12 < 1) {
    pcVar11 = "url";
    paVar10 = paVar15;
  }
  else {
    pcVar11 = "url" + sVar12;
    lVar13 = 0;
    do {
      paVar10 = (attribute *)((long)&paVar15->id + 3);
      if (lVar13 == 3) goto LAB_00107e2a;
      if (*(char *)((long)&paVar15->id + lVar13) != "url"[lVar13]) goto LAB_00107edc;
      lVar2 = lVar13 + 1;
      lVar13 = lVar13 + 1;
      paVar10 = paVar6;
    } while ((attribute *)((long)&paVar15->id + lVar2) != paVar6);
  }
  if (*pcVar11 == '\0') {
LAB_00107e2a:
    if (paVar10 < paVar6) {
      bVar16 = true;
      paVar7 = (attribute *)0x0;
      do {
        uVar9 = (ulong)(byte)paVar10->id;
        paVar8 = paVar10;
        if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
        paVar10 = (attribute *)((long)&paVar10->id + 1);
        bVar16 = paVar10 < paVar6;
        paVar8 = paVar6;
      } while (paVar10 != paVar6);
      if ((((bVar16) && (paVar8 < paVar6)) && ((char)paVar8->id == '(')) &&
         (paVar10 = (attribute *)((long)&paVar8->id + 1), paVar10 < paVar6)) {
        bVar16 = true;
        do {
          uVar9 = (ulong)(byte)paVar10->id;
          paVar8 = paVar10;
          if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
          paVar10 = (attribute *)((long)&paVar10->id + 1);
          bVar16 = paVar10 < paVar6;
          paVar8 = paVar6;
        } while (paVar10 != paVar6);
        if (((bVar16) && (paVar8 < paVar6)) && ((char)paVar8->id == '#')) {
          paVar10 = (attribute *)((long)&paVar8->id + 1);
          (paint->id).data = (char *)paVar10;
          (paint->id).length = 0;
          if (paVar10 < paVar6) {
            pcVar11 = (char *)((long)paVar6 + (-2 - (long)paVar8));
            sVar14 = 1;
            do {
              if (*(char *)((long)&paVar8->id + sVar14) == ')') {
                paVar10 = (attribute *)((long)&paVar8->id + sVar14 + 1);
                paVar15 = paVar10;
                if (paVar6 <= paVar10) goto LAB_00108170;
                piVar3 = &paVar10->id;
                goto LAB_00108156;
              }
              (paint->id).length = sVar14;
              sVar14 = sVar14 + 1;
              bVar16 = pcVar11 != (char *)0x0;
              pcVar11 = pcVar11 + -1;
            } while (bVar16);
          }
        }
      }
    }
  }
LAB_00107edc:
  if ((long)sVar12 < 1) {
    pcVar11 = "var";
    paVar10 = paVar15;
  }
  else {
    pcVar11 = "var" + sVar12;
    paVar7 = (attribute *)((long)&paVar15->id + 3);
    lVar13 = 0;
    do {
      if (lVar13 == 3) goto LAB_00107f48;
      if (*(char *)((long)&paVar15->id + lVar13) != "var"[lVar13]) goto LAB_00107f25;
      lVar2 = lVar13 + 1;
      lVar13 = lVar13 + 1;
      paVar10 = paVar6;
    } while ((attribute *)((long)&paVar15->id + lVar2) != paVar6);
  }
  paVar7 = paVar10;
  if (*pcVar11 != '\0') {
LAB_00107f25:
    local_38 = paVar15;
    _Var4 = parse_color_value((char **)&local_38,(char *)paVar6,&paint->color);
    paVar7 = (attribute *)(ulong)_Var4;
    if (_Var4) {
      paint->type = paint_type_color;
    }
    goto LAB_00107d2f;
  }
LAB_00107f48:
  if (paVar6 <= paVar7) goto LAB_00107d2f;
  bVar16 = true;
  paVar15 = paVar7;
  do {
    uVar9 = (ulong)(byte)paVar15->id;
    paVar7 = paVar15;
    if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
    paVar15 = (attribute *)((long)&paVar15->id + 1);
    bVar16 = paVar15 < paVar6;
    paVar7 = paVar6;
  } while (paVar15 != paVar6);
  if ((((!bVar16) || (paVar6 <= paVar7)) || ((char)paVar7->id != '(')) ||
     (paVar7 = (attribute *)((long)&paVar7->id + 1), paVar6 <= paVar7)) goto LAB_00107d2f;
  bVar16 = true;
  paVar15 = paVar7;
  do {
    uVar9 = (ulong)(byte)paVar15->id;
    paVar7 = paVar15;
    if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
    paVar15 = (attribute *)((long)&paVar15->id + 1);
    bVar16 = paVar15 < paVar6;
    paVar7 = paVar6;
  } while (paVar15 != paVar6);
  if (!bVar16) goto LAB_00107d2f;
  if (paVar7 < paVar6) {
    pcVar11 = "--" + ((long)paVar6 - (long)paVar7);
    lVar13 = 0;
    do {
      paVar15 = (attribute *)((long)&paVar7->id + 2);
      if (lVar13 == 2) goto LAB_0010802f;
      if (*(char *)((long)&paVar7->id + lVar13) != "--"[lVar13]) goto LAB_00107d2f;
      lVar2 = lVar13 + 1;
      lVar13 = lVar13 + 1;
      paVar15 = paVar6;
    } while ((attribute *)((long)&paVar7->id + lVar2) != paVar6);
  }
  else {
    pcVar11 = "--";
    paVar15 = paVar7;
  }
  paVar7 = paVar15;
  paVar15 = paVar7;
  if (*pcVar11 != '\0') goto LAB_00107d2f;
LAB_0010802f:
  paVar7 = paVar15;
  if (paVar15 < paVar6) {
    sVar12 = 0;
    do {
      bVar1 = (byte)paVar7->id;
      if (((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x3a)) &&
         ((bVar1 != 0x5f && (9 < (byte)(bVar1 - 0x30) && 1 < (byte)(bVar1 - 0x2d))))) {
        paint->type = paint_type_var;
        (paint->id).data = (char *)paVar15;
        (paint->id).length = sVar12;
        (paint->color).value = 0;
        paVar15 = (attribute *)((char *)((long)paVar6 + (-sVar12 - (long)paVar15)) + (long)paVar7);
        goto LAB_001081f2;
      }
      paVar7 = (attribute *)((long)&paVar7->id + 1);
      sVar12 = sVar12 + 1;
    } while (paVar7 < paVar6);
  }
  paint->type = paint_type_var;
  (paint->id).data = (char *)paVar15;
  (paint->id).length = (long)paVar7 - (long)paVar15;
  (paint->color).value = 0;
  local_38 = paVar7;
  goto LAB_001080a9;
  while (paVar10 = (attribute *)((long)&paVar10->id + 1),
        paVar15 = (attribute *)((long)piVar3 + (long)pcVar11), paVar10 != paVar6) {
LAB_00108156:
    uVar9 = (ulong)(byte)paVar10->id;
    paVar15 = paVar10;
    if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
  }
LAB_00108170:
  paint->type = paint_type_url;
  (paint->color).value = 0;
  if (paVar15 < paVar6) {
    bVar16 = true;
    do {
      uVar9 = (ulong)(byte)paVar15->id;
      local_38 = paVar15;
      if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
      paVar15 = (attribute *)((long)&paVar15->id + 1);
      bVar16 = paVar15 < paVar6;
      local_38 = paVar6;
    } while (paVar15 != paVar6);
    if (bVar16) {
      _Var4 = parse_color_value((char **)&local_38,(char *)paVar6,&paint->color);
      paVar7 = (attribute *)(ulong)_Var4;
    }
  }
  goto LAB_00107d2f;
  while (paVar7 = (attribute *)((long)&paVar7->id + 1), local_38 = paVar15, paVar7 != paVar6) {
LAB_001081f2:
    uVar9 = (ulong)(byte)paVar7->id;
    local_38 = paVar7;
    if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
  }
LAB_001080a9:
  if ((local_38 < paVar6) && ((char)local_38->id == ',')) {
    paVar7 = (attribute *)((long)&local_38->id + 1);
    local_38 = paVar7;
    if (paVar7 < paVar6) {
      do {
        uVar9 = (ulong)(byte)paVar7->id;
        local_38 = paVar7;
        if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
        paVar7 = (attribute *)((long)&paVar7->id + 1);
        local_38 = paVar6;
      } while (paVar7 != paVar6);
    }
    _Var4 = parse_color_value((char **)&local_38,(char *)paVar6,&paint->color);
    paVar7 = (attribute *)(ulong)_Var4;
    if (!_Var4) goto LAB_00107d2f;
  }
  paVar7 = local_38;
  if (((paVar7 < paVar6) && ((char)paVar7->id == ')')) &&
     (paVar7 = (attribute *)((long)&paVar7->id + 1), paVar7 < paVar6)) {
    do {
      uVar9 = (ulong)(byte)paVar7->id;
      if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
      paVar7 = (attribute *)((long)&paVar7->id + 1);
    } while (paVar7 != paVar6);
  }
LAB_00107d2f:
  return SUB81(paVar7,0);
}

Assistant:

static bool parse_paint(const element_t* element, int id, paint_t* paint)
{
    const string_t* value = find_attribute(element, id, true);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(skip_string(&it, end, "none")) {
        paint->type = paint_type_none;
        return !skip_ws(&it, end);
    }

    if(parse_url_value(&it, end, &paint->id)) {
        paint->type = paint_type_url;
        paint->color.value = 0x00000000;
        if(skip_ws(&it, end)) {
            if(!parse_color_value(&it, end, &paint->color)) {
                return false;
            }
        }

        return it == end;
    }

    if(skip_string(&it, end, "var")) {
        if(!skip_ws(&it, end)
            || !skip_delim(&it, end, '(')
            || !skip_ws(&it, end)) {
            return false;
        }

        if(!skip_string(&it, end, "--"))
            return false;
        const char* begin = it;
        while(it < end && IS_NAMECHAR(*it))
            ++it;
        paint->type = paint_type_var;
        paint->id.data = begin;
        paint->id.length = it - begin;
        paint->color.value = 0x00000000;
        skip_ws(&it, end);
        if(skip_delim(&it, end, ',')) {
            skip_ws(&it, end);
            if(!parse_color_value(&it, end, &paint->color)) {
                return false;
            }
        }

        return skip_delim(&it, end, ')') && !skip_ws(&it, end);
    }

    if(parse_color_value(&it, end, &paint->color)) {
        paint->type = paint_type_color;
        return it == end;
    }

    return false;
}